

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Abc_NtkFxInsert(Abc_Ntk_t *pNtk,Vec_Wec_t *vCubes)

{
  Mem_Flex_t *pMan;
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  Abc_Obj_t *pAVar7;
  Vec_Int_t *p;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  Abc_Obj_t *pAVar10;
  char *pSop_00;
  int local_70;
  int iNodeMax;
  int iFanin;
  int Lit;
  int v;
  int k;
  int i;
  char *pSop;
  char *pCube;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Vec_Int_t *vCount;
  Vec_Int_t *vFirst;
  Vec_Int_t *vPres;
  Vec_Int_t *vCube;
  Vec_Wec_t *vCubes_local;
  Abc_Ntk_t *pNtk_local;
  
  local_70 = 0;
  iVar2 = Abc_NtkIsSopLogic(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                  ,0xbb,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
  }
  iNodeMax = -1;
  v = 0;
  while( true ) {
    iVar2 = Vec_WecSize(vCubes);
    if (iVar2 <= v) {
      for (v = 0; iVar2 = Vec_WecSize(vCubes), v < iVar2; v = v + 1) {
        pVVar6 = Vec_WecEntry(vCubes,v);
        iVar2 = Vec_IntEntry(pVVar6,0);
        local_70 = Abc_MaxInt(local_70,iVar2);
      }
      iVar2 = Abc_NtkObjNumMax(pNtk);
      if (local_70 < iVar2) {
        printf("The network is unchanged by fast extract.\n");
      }
      else {
        for (v = Abc_NtkObjNumMax(pNtk); v <= local_70; v = v + 1) {
          pAVar7 = Abc_NtkCreateNode(pNtk);
          uVar3 = Abc_ObjId(pAVar7);
          if (v != uVar3) {
            __assert_fail("i == (int)Abc_ObjId(pNode)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                          ,0xd1,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
          }
        }
        iVar2 = Abc_NtkObjNumMax(pNtk);
        pVVar6 = Vec_IntStart(iVar2);
        iVar2 = Abc_NtkObjNumMax(pNtk);
        p = Vec_IntStart(iVar2);
        for (v = 0; iVar2 = Vec_WecSize(vCubes), v < iVar2; v = v + 1) {
          pVVar8 = Vec_WecEntry(vCubes,v);
          iVar2 = Vec_IntEntry(pVVar8,0);
          iVar4 = Vec_IntEntry(p,iVar2);
          if (iVar4 == 0) {
            Vec_IntWriteEntry(pVVar6,iVar2,v);
          }
          Vec_IntAddToEntry(p,iVar2,1);
        }
        iVar2 = Abc_NtkObjNumMax(pNtk);
        pVVar8 = Vec_IntStartFull(iVar2);
        for (v = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), v < iVar2; v = v + 1) {
          pAVar7 = Abc_NtkObj(pNtk,v);
          if ((pAVar7 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar7), iVar2 != 0)) {
            Abc_ObjRemoveFanins(pAVar7);
            iVar2 = Vec_IntEntry(p,v);
            if (iVar2 < 1) {
              __assert_fail("Vec_IntEntry(vCount, i) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                            ,0xe4,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
            }
            for (Lit = 0; iVar2 = Vec_IntEntry(p,v), Lit < iVar2; Lit = Lit + 1) {
              iVar2 = Vec_IntEntry(pVVar6,v);
              pVVar9 = Vec_WecEntry(vCubes,iVar2 + Lit);
              iVar2 = Vec_IntEntry(pVVar9,0);
              if (iVar2 != v) {
                __assert_fail("Vec_IntEntry( vCube, 0 ) == i",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                              ,0xe8,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
              }
              for (iFanin = 1; iVar2 = Vec_IntSize(pVVar9), iFanin < iVar2; iFanin = iFanin + 1) {
                iVar2 = Vec_IntEntry(pVVar9,iFanin);
                iVar2 = Abc_Lit2Var(iVar2);
                pAVar10 = Abc_NtkObj(pNtk,iVar2);
                uVar3 = Abc_ObjId(pAVar10);
                iVar2 = Vec_IntEntry(pVVar8,uVar3);
                if (iVar2 < 0) {
                  uVar3 = Abc_ObjId(pAVar10);
                  iVar2 = Abc_ObjFaninNum(pAVar7);
                  Vec_IntWriteEntry(pVVar8,uVar3,iVar2);
                  Abc_ObjAddFanin(pAVar7,pAVar10);
                }
              }
            }
            pMan = (Mem_Flex_t *)pNtk->pManFunc;
            iVar2 = Vec_IntEntry(p,v);
            iVar4 = Abc_ObjFaninNum(pAVar7);
            pSop_00 = Abc_SopStart(pMan,iVar2,iVar4);
            pSop = pSop_00;
            for (Lit = 0; iVar2 = Vec_IntEntry(p,v), Lit < iVar2; Lit = Lit + 1) {
              iVar2 = Vec_IntEntry(pVVar6,v);
              pVVar9 = Vec_WecEntry(vCubes,iVar2 + Lit);
              iVar2 = Vec_IntEntry(pVVar9,0);
              if (iVar2 != v) {
                __assert_fail("Vec_IntEntry( vCube, 0 ) == i",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                              ,0xf7,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
              }
              for (iFanin = 1; iVar2 = Vec_IntSize(pVVar9), iFanin < iVar2; iFanin = iFanin + 1) {
                iVar2 = Vec_IntEntry(pVVar9,iFanin);
                iVar4 = Abc_Lit2Var(iVar2);
                pAVar10 = Abc_NtkObj(pNtk,iVar4);
                uVar3 = Abc_ObjId(pAVar10);
                iVar4 = Vec_IntEntry(pVVar8,uVar3);
                if ((iVar4 < 0) || (iVar5 = Abc_ObjFaninNum(pAVar7), iVar5 <= iVar4)) {
                  __assert_fail("iFanin >= 0 && iFanin < Abc_ObjFaninNum(pNode)",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                                ,0xfc,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
                }
                iVar2 = Abc_LitIsCompl(iVar2);
                cVar1 = '1';
                if (iVar2 != 0) {
                  cVar1 = '0';
                }
                pSop[iVar4] = cVar1;
              }
              iVar2 = Abc_ObjFaninNum(pAVar7);
              pSop = pSop + (iVar2 + 3);
            }
            if (((pAVar7->field_5).pData != (void *)0x0) &&
               (iVar2 = Abc_SopIsComplement((char *)(pAVar7->field_5).pData), iVar2 != 0)) {
              Abc_SopComplement(pSop_00);
            }
            (pAVar7->field_5).pData = pSop_00;
            for (iFanin = 0; iVar2 = Abc_ObjFaninNum(pAVar7), iFanin < iVar2; iFanin = iFanin + 1) {
              pAVar10 = Abc_ObjFanin(pAVar7,iFanin);
              uVar3 = Abc_ObjId(pAVar10);
              Vec_IntWriteEntry(pVVar8,uVar3,-1);
            }
          }
        }
        Vec_IntFree(pVVar6);
        Vec_IntFree(p);
        Vec_IntFree(pVVar8);
      }
      return;
    }
    pVVar6 = Vec_WecEntry(vCubes,v);
    iVar2 = Vec_IntSize(pVVar6);
    if (iVar2 < 1) {
      __assert_fail("Vec_IntSize(vCube) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                    ,0xc0,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
    }
    iVar2 = Vec_IntEntry(pVVar6,0);
    if (iVar2 < iNodeMax) break;
    iNodeMax = Vec_IntEntry(pVVar6,0);
    v = v + 1;
  }
  __assert_fail("Lit <= Vec_IntEntry(vCube, 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                ,0xc1,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
}

Assistant:

void Abc_NtkFxInsert( Abc_Ntk_t * pNtk, Vec_Wec_t * vCubes )
{
    Vec_Int_t * vCube, * vPres, * vFirst, * vCount;
    Abc_Obj_t * pNode, * pFanin;
    char * pCube, * pSop;
    int i, k, v, Lit, iFanin, iNodeMax = 0;
    assert( Abc_NtkIsSopLogic(pNtk) );
    // check that cubes have no gaps and are ordered by first node
    Lit = -1;
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        assert( Vec_IntSize(vCube) > 0 );
        assert( Lit <= Vec_IntEntry(vCube, 0) );
        Lit = Vec_IntEntry(vCube, 0);
    }
    // find the largest index
    Vec_WecForEachLevel( vCubes, vCube, i )
        iNodeMax = Abc_MaxInt( iNodeMax, Vec_IntEntry(vCube, 0) );
    // quit if nothing changes
    if ( iNodeMax < Abc_NtkObjNumMax(pNtk) )
    {
        printf( "The network is unchanged by fast extract.\n" );
        return;
    }
    // create new nodes
    for ( i = Abc_NtkObjNumMax(pNtk); i <= iNodeMax; i++ )
    {
        pNode = Abc_NtkCreateNode( pNtk );
        assert( i == (int)Abc_ObjId(pNode) );
    }
    // create node fanins
    vFirst = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    vCount = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        iFanin = Vec_IntEntry( vCube, 0 );
        if ( Vec_IntEntry(vCount, iFanin) == 0 )
            Vec_IntWriteEntry( vFirst, iFanin, i );
        Vec_IntAddToEntry( vCount, iFanin, 1 );
    }
    // create node SOPs
    vPres = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
//        if ( Vec_IntEntry(vCount, i) == 0 ) continue;
        Abc_ObjRemoveFanins( pNode );
        // create fanins
        assert( Vec_IntEntry(vCount, i) > 0 );
        for ( k = 0; k < Vec_IntEntry(vCount, i); k++ )
        {
            vCube = Vec_WecEntry( vCubes, Vec_IntEntry(vFirst, i) + k );
            assert( Vec_IntEntry( vCube, 0 ) == i );
            Vec_IntForEachEntryStart( vCube, Lit, v, 1 )
            {
                pFanin = Abc_NtkObj(pNtk, Abc_Lit2Var(Lit));
                if ( Vec_IntEntry(vPres, Abc_ObjId(pFanin)) >= 0 )
                    continue;
                Vec_IntWriteEntry(vPres, Abc_ObjId(pFanin), Abc_ObjFaninNum(pNode));
                Abc_ObjAddFanin( pNode, pFanin );
            }
        }
        // create SOP
        pSop = pCube = Abc_SopStart( (Mem_Flex_t *)pNtk->pManFunc, Vec_IntEntry(vCount, i), Abc_ObjFaninNum(pNode) );
        for ( k = 0; k < Vec_IntEntry(vCount, i); k++ )
        {
            vCube = Vec_WecEntry( vCubes, Vec_IntEntry(vFirst, i) + k );
            assert( Vec_IntEntry( vCube, 0 ) == i );
            Vec_IntForEachEntryStart( vCube, Lit, v, 1 )
            {
                pFanin = Abc_NtkObj(pNtk, Abc_Lit2Var(Lit));
                iFanin = Vec_IntEntry(vPres, Abc_ObjId(pFanin));
                assert( iFanin >= 0 && iFanin < Abc_ObjFaninNum(pNode) );
                pCube[iFanin] = Abc_LitIsCompl(Lit) ? '0' : '1';
            }
            pCube += Abc_ObjFaninNum(pNode) + 3;
        }
        // complement SOP if the original one was complemented
        if ( pNode->pData && Abc_SopIsComplement((char *)pNode->pData) )
            Abc_SopComplement( pSop );
        pNode->pData = pSop;
        // clean fanins
        Abc_ObjForEachFanin( pNode, pFanin, v )
            Vec_IntWriteEntry( vPres, Abc_ObjId(pFanin), -1 );
    }
    Vec_IntFree( vFirst );
    Vec_IntFree( vCount );
    Vec_IntFree( vPres );
}